

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool upb_strtable_resize(upb_strtable *t,size_t size_lg2,upb_Arena *a)

{
  lookupkey_t key;
  upb_value uVar1;
  char *pcVar2;
  _Bool _Var3;
  uint uVar4;
  uint32_t hash_00;
  upb_key tabkey_00;
  uint32_t hash;
  upb_key tabkey;
  lookupkey_t lookupkey;
  upb_SizePrefixString *keystr;
  upb_value val;
  upb_StringView sv;
  intptr_t iter;
  upb_strtable new_table;
  upb_Arena *a_local;
  size_t size_lg2_local;
  upb_strtable *t_local;
  
  new_table.t._8_8_ = a;
  uVar4 = init((EVP_PKEY_CTX *)&iter);
  if ((uVar4 & 1) == 0) {
    t_local._7_1_ = false;
  }
  else {
    sv.size = 0xffffffffffffffff;
    while (_Var3 = upb_strtable_next2(t,(upb_StringView *)&val,(upb_value *)&keystr,
                                      (intptr_t *)&sv.size), pcVar2 = sv.data, uVar1 = val, _Var3) {
      tabkey_00.str = (upb_SizePrefixString *)(val.val - 4);
      if ((char *)(ulong)(tabkey_00.str)->size != sv.data) {
        __assert_fail("keystr->size == sv.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                      ,0x1eb,"_Bool upb_strtable_resize(upb_strtable *, size_t, upb_Arena *)");
      }
      hash_00 = _upb_Hash_NoSeed((char *)val.val,(size_t)sv.data);
      key.str.size = (size_t)pcVar2;
      key.num = uVar1.val;
      insert((upb_table *)&iter,key,tabkey_00,(upb_value)keystr,hash_00,strhash,streql);
    }
    (t->t).entries = (upb_tabent *)iter;
    *(upb_tabent **)&(t->t).count = new_table.t.entries;
    t_local._7_1_ = true;
  }
  return t_local._7_1_;
}

Assistant:

bool upb_strtable_resize(upb_strtable* t, size_t size_lg2, upb_Arena* a) {
  upb_strtable new_table;
  if (!init(&new_table.t, size_lg2, a)) return false;

  intptr_t iter = UPB_STRTABLE_BEGIN;
  upb_StringView sv;
  upb_value val;
  while (upb_strtable_next2(t, &sv, &val, &iter)) {
    // Unlike normal insert, does not copy string data or possibly reallocate
    // the table
    // The data pointer used in the table is guaranteed to point at a
    // upb_SizePrefixString, we just need to back up by the size of the uint32_t
    // length prefix.
    const upb_SizePrefixString* keystr =
        (const upb_SizePrefixString*)(sv.data - sizeof(uint32_t));
    UPB_ASSERT(keystr->data == sv.data);
    UPB_ASSERT(keystr->size == sv.size);

    lookupkey_t lookupkey = {.str = sv};
    upb_key tabkey = {.str = keystr};
    uint32_t hash = _upb_Hash_NoSeed(sv.data, sv.size);
    insert(&new_table.t, lookupkey, tabkey, val, hash, &strhash, &streql);
  }
  *t = new_table;
  return true;
}